

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O1

int add_map_item(AMQP_VALUE map,char *name,char *value)

{
  int iVar1;
  AMQP_VALUE key;
  AMQP_VALUE value_00;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  key = amqpvalue_create_symbol(name);
  if (key == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1a2;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
              ,"add_map_item",0x1a1,1,"Failed creating AMQP_VALUE for name");
    return 0x1a2;
  }
  if (value == (char *)0x0) {
    value_00 = amqpvalue_create_null();
    if (value_00 != (AMQP_VALUE)0x0) goto LAB_00143e50;
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1ab;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00143f27;
    pcVar4 = "Failed creating AMQP_VALUE for NULL value";
    iVar3 = 0x1aa;
  }
  else {
    value_00 = (AMQP_VALUE)0x0;
LAB_00143e50:
    if ((value == (char *)0x0) ||
       (value_00 = amqpvalue_create_string(value), value_00 != (AMQP_VALUE)0x0)) {
      iVar1 = amqpvalue_set_map_value(map,key,value_00);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x1b7;
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"add_map_item",0x1b6,1,"Failed adding key/value pair to map");
        }
      }
      amqpvalue_destroy(value_00);
      goto LAB_00143f27;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1b0;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00143f27;
    pcVar4 = "Failed creating AMQP_VALUE for value";
    iVar3 = 0x1af;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
            ,"add_map_item",iVar3,1,pcVar4);
LAB_00143f27:
  amqpvalue_destroy(key);
  return iVar1;
}

Assistant:

static int add_map_item(AMQP_VALUE map, const char* name, const char* value)
{
    int result;
    AMQP_VALUE amqp_value_name;

    if ((amqp_value_name = amqpvalue_create_symbol(name)) == NULL)
    {
        LogError("Failed creating AMQP_VALUE for name");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE amqp_value_value = NULL;

        if (value == NULL && (amqp_value_value = amqpvalue_create_null()) == NULL)
        {
            LogError("Failed creating AMQP_VALUE for NULL value");
            result = MU_FAILURE;
        }
        else if (value != NULL && (amqp_value_value = amqpvalue_create_string(value)) == NULL)
        {
            LogError("Failed creating AMQP_VALUE for value");
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_map_value(map, amqp_value_name, amqp_value_value) != 0)
            {
                LogError("Failed adding key/value pair to map");
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }

            amqpvalue_destroy(amqp_value_value);
        }

        amqpvalue_destroy(amqp_value_name);
    }

    return result;
}